

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcEllipseProfileDef::~IfcEllipseProfileDef
          (IfcEllipseProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcEllipseProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEllipseProfileDef,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEllipseProfileDef,_2UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,vtt + 10);
  IfcParameterizedProfileDef::~IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,vtt + 1);
  return;
}

Assistant:

IfcEllipseProfileDef() : Object("IfcEllipseProfileDef") {}